

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QIBusAttribute>::copyAppend
          (QGenericArrayOps<QIBusAttribute> *this,QIBusAttribute *b,QIBusAttribute *e)

{
  QIBusAttribute *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  quint32 qVar4;
  quint32 qVar5;
  quint32 qVar6;
  long lVar7;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QIBusAttribute>).ptr;
    lVar7 = (this->super_QArrayDataPointer<QIBusAttribute>).size;
    do {
      pDVar2 = (b->super_QIBusSerializable).name.d.d;
      pQVar1[lVar7].super_QIBusSerializable.name.d.d = pDVar2;
      pQVar1[lVar7].super_QIBusSerializable.name.d.ptr = (b->super_QIBusSerializable).name.d.ptr;
      pQVar1[lVar7].super_QIBusSerializable.name.d.size = (b->super_QIBusSerializable).name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar3 = (b->super_QIBusSerializable).attachments.d;
      pQVar1[lVar7].super_QIBusSerializable.attachments.d = pDVar3;
      if ((pDVar3 != (Data *)0x0) &&
         ((pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
        LOCK();
        (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qVar4 = b->value;
      qVar5 = b->start;
      qVar6 = b->end;
      pQVar1[lVar7].type = b->type;
      pQVar1[lVar7].value = qVar4;
      pQVar1[lVar7].start = qVar5;
      pQVar1[lVar7].end = qVar6;
      b = b + 1;
      lVar7 = (this->super_QArrayDataPointer<QIBusAttribute>).size + 1;
      (this->super_QArrayDataPointer<QIBusAttribute>).size = lVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }